

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O3

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort16Parallel
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  uchar uVar1;
  uint16_t *puVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t i_1;
  uchar **ppuVar9;
  size_t bgn_00;
  uint16_t uVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  undefined7 in_register_00000081;
  size_t cnt [65536];
  ulong auStack_80038 [65537];
  
  memset(auStack_80038,0,0x80000);
  ppuVar9 = this->temp_;
  ppuVar4 = this->data_;
  if ((int)CONCAT71(in_register_00000081,flip) != 0) {
    ppuVar9 = this->data_;
    ppuVar4 = this->temp_;
  }
  puVar2 = this->letters16_;
  sVar8 = bgn;
  if (end != bgn) {
    do {
      uVar1 = ppuVar4[sVar8][depth];
      if (uVar1 == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = CONCAT11(uVar1,ppuVar4[sVar8][depth + 1]);
      }
      puVar2[sVar8] = uVar10;
      sVar8 = sVar8 + 1;
    } while (end != sVar8);
    sVar8 = bgn;
    if (end != bgn) {
      do {
        auStack_80038[puVar2[sVar8]] = auStack_80038[puVar2[sVar8]] + 1;
        sVar8 = sVar8 + 1;
      } while (end != sVar8);
    }
  }
  lVar11 = 0;
  uVar6 = 0;
  do {
    uVar5 = auStack_80038[lVar11];
    auStack_80038[lVar11] = uVar6;
    lVar11 = lVar11 + 1;
    uVar6 = uVar5 + uVar6;
  } while (lVar11 != 0x10000);
  sVar8 = bgn;
  if (end != bgn) {
    do {
      uVar6 = auStack_80038[puVar2[sVar8]];
      auStack_80038[puVar2[sVar8]] = uVar6 + 1;
      puVar3 = ppuVar9[bgn + uVar6];
      ppuVar9[bgn + uVar6] = ppuVar4[sVar8];
      ppuVar4[sVar8] = puVar3;
      sVar8 = sVar8 + 1;
    } while (end != sVar8);
  }
  if (!flip) {
    lVar11 = 0;
    do {
      if (lVar11 == 0) {
        lVar12 = 0;
        uVar6 = 0;
      }
      else {
        lVar12 = lVar11 << 8;
        uVar6 = auStack_80038[lVar11 * 0x100 + -1];
      }
      uVar5 = auStack_80038[lVar12];
      if (uVar6 < uVar5) {
        do {
          ppuVar4[bgn + uVar6] = ppuVar9[bgn + uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x100);
  }
  uVar6 = depth + 2;
  lVar11 = 1;
  do {
    if ((char)lVar11 != '\0') {
      uVar5 = auStack_80038[lVar11] - auStack_80038[lVar11 + -1];
      if (uVar5 != 0) {
        bgn_00 = auStack_80038[lVar11 + -1] + bgn;
        sVar8 = auStack_80038[lVar11] + bgn;
        if ((uVar6 < 100) && (0x1e < uVar5)) {
          if (uVar5 < 0x10000) {
            Sort8(this,bgn_00,sVar8,uVar6,!flip);
          }
          else {
            Sort16(this,bgn_00,sVar8,uVar6,!flip);
          }
        }
        else {
          uVar7 = uVar5;
          sVar13 = bgn_00;
          if (bgn_00 < sVar8 && !flip) {
            do {
              ppuVar4 = this->temp_;
              puVar3 = this->data_[sVar13];
              this->data_[sVar13] = ppuVar4[sVar13];
              ppuVar4[sVar13] = puVar3;
              uVar7 = uVar7 - 1;
              sVar13 = sVar13 + 1;
            } while (uVar7 != 0);
          }
          if (1 < uVar5) {
            ppuVar4 = this->data_ + sVar8;
            ppuVar9 = this->data_ + bgn_00;
            uVar5 = (long)(sVar8 * 8 + bgn_00 * -8) >> 3;
            lVar12 = 0x3f;
            if (uVar5 != 0) {
              for (; uVar5 >> lVar12 == 0; lVar12 = lVar12 + -1) {
              }
            }
            std::
            __introsort_loop<unsigned_char_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                      (ppuVar9,ppuVar4,(ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
                       (_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<const_unsigned_char_*>_>
                        )(int)uVar6);
            std::
            __final_insertion_sort<unsigned_char_const**,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                      (ppuVar9,ppuVar4,(Compare<const_unsigned_char_*>)(int)uVar6);
          }
        }
      }
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10000);
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort16Parallel(size_t bgn, size_t end, size_t depth, bool flip) {
  size_t cnt[1 << 16] = {};

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint16_t *let = letters16_ + bgn;
  size_t n = end - bgn;

  #ifdef _OPENMP
  #pragma omp parallel for schedule(static)
  #endif
  for (size_t i = 0; i < n; ++i) {
    uint16_t x = src[i][depth];
    let[i] = x == 0 ? 0 : ((x << 8) | src[i][depth + 1]);
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  {
    size_t s = 0;
    for (int i = 0; i < 1 << 16; ++i) {
      std::swap(cnt[i], s);
      s += cnt[i];
    }
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    #ifdef _OPENMP
    #pragma omp parallel for schedule(static)
    #endif
    for (int i = 0; i < 1 << 8; ++i) {
      size_t b = i == 0 ? 0 : cnt[(i << 8) - 1];
      size_t e = cnt[i << 8];
      for (size_t j = b; j < e; ++j) {
        src[j] = dst[j];
      }
    }
  }

  #ifdef _OPENMP
  #pragma omp parallel for schedule(dynamic)
  #endif
  for (size_t i = 1; i < 1 << 16; ++i) {
    if ((i & 0xFF) != 0 && cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 2, !flip);
    }
  }
}